

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_foreach_stream
              (quicly_conn_t *conn,void *thunk,_func_int_void_ptr_quicly_stream_t_ptr *cb)

{
  int iVar1;
  kh_quicly_stream_t_t *pkVar2;
  byte bVar3;
  uint uVar4;
  
  pkVar2 = conn->streams;
  if (pkVar2->n_buckets != 0) {
    bVar3 = 0;
    uVar4 = 0;
    do {
      if ((((pkVar2->flags[uVar4 >> 4] >> (bVar3 & 0x1e) & 3) == 0) &&
          (-1 < pkVar2->vals[uVar4]->stream_id)) &&
         (iVar1 = (*cb)(thunk,pkVar2->vals[uVar4]), iVar1 != 0)) {
        return iVar1;
      }
      uVar4 = uVar4 + 1;
      pkVar2 = conn->streams;
      bVar3 = bVar3 + 2;
    } while (uVar4 != pkVar2->n_buckets);
  }
  return 0;
}

Assistant:

int quicly_foreach_stream(quicly_conn_t *conn, void *thunk, int (*cb)(void *thunk, quicly_stream_t *stream))
{
    quicly_stream_t *stream;
    kh_foreach_value(conn->streams, stream, {
        if (stream->stream_id >= 0) {
            int ret = cb(thunk, stream);
            if (ret != 0)
                return ret;
        }
    });
    return 0;
}